

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBlobReset(SyBlob *pBlob)

{
  SyBlob *pBlob_local;
  
  pBlob->nByte = 0;
  if ((pBlob->nFlags & 4) != 0) {
    pBlob->pBlob = (void *)0x0;
    pBlob->mByte = 0;
    pBlob->nFlags = pBlob->nFlags & 0xfffffffb;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobReset(SyBlob *pBlob)
{
	pBlob->nByte = 0;
	if( pBlob->nFlags & SXBLOB_RDONLY ){
		/* Read-only (Not malloced chunk) */
		pBlob->pBlob = 0;
		pBlob->mByte = 0;
		pBlob->nFlags &= ~SXBLOB_RDONLY;
	}
	return SXRET_OK;
}